

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::checkResults
          (TextureCubeMapArrayTextureSizeRTComputeShader *this,GLuint width,GLuint height,
          GLuint depth,STORAGE_TYPE storType)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  char **local_200;
  uint local_1d8 [4];
  MessageBuilder local_1c8;
  GLuint local_48;
  STORAGE_TYPE local_44;
  GLuint read_size [4];
  Functions *gl;
  GLboolean test_passed;
  STORAGE_TYPE storType_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  long lVar4;
  
  storType_local = height;
  depth_local = width;
  _height_local = this;
  gl._7_1_ = TextureCubeMapArrayTextureSizeRTBase::checkResults
                       (&this->super_TextureCubeMapArrayTextureSizeRTBase,width,height,depth,
                        storType);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  memset(&local_48,0,0x10);
  (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_img_id,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x67b);
  TextureCubeMapArrayTextureSizeRTBase::checkFramebufferStatus
            (&this->super_TextureCubeMapArrayTextureSizeRTBase,0x8ca8);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d99,0x1405,&local_48);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x681);
  if (((local_48 != depth_local) || (local_44 != storType_local)) || (read_size[0] != depth / 6)) {
    this_00 = tcu::TestNode::getTestContext((TestNode *)this);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [15])"Storage Type: ");
    if (storType == ST_MUTABLE) {
      local_200 = (char **)&mutableStorage;
    }
    else {
      local_200 = &imMutableStorage;
    }
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_200);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [99])
                               "imageSize() for imageCubeArray returned wrong values of [width][height][layers]. They are equal to"
                       );
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c316fc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_48);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_44);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,read_size);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"] but should be ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c316fc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&depth_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&storType_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
    local_1d8[0] = depth / 6;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    gl._7_1_ = '\0';
  }
  return gl._7_1_;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTComputeShader::checkResults(glw::GLuint width, glw::GLuint height,
																		   glw::GLuint depth, STORAGE_TYPE storType)
{
	glw::GLboolean test_passed = TextureCubeMapArrayTextureSizeRTBase::checkResults(width, height, depth, storType);

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint read_size[m_n_rt_components];
	memset(read_size, 0, m_n_rt_components * sizeof(glw::GLuint));

	/* Compare returned results of imageSize() for imageCubeArray image */
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_img_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "imageSize() for imageCubeArray returned wrong values of [width][height][layers]. They are equal to"
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}